

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

void __thiscall
CVmObjTimeZone::restore_from_file
          (CVmObjTimeZone *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  CVmVarHeap *pCVar1;
  long lVar2;
  CVmFile *this_00;
  size_t namelen;
  CVmTimeZone *pCVar3;
  vm_tzobj_ext *pvVar4;
  CVmTimeZone *in_RDI;
  vm_tzobj_ext *ext;
  CVmTimeZone *tz;
  size_t len;
  char name [256];
  os_tzinfo_t desc;
  size_t in_stack_fffffffffffffe48;
  CVmFile *in_stack_fffffffffffffe50;
  CVmFile *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe78;
  CVmTimeZoneCache *in_stack_fffffffffffffe80;
  int local_7c;
  int local_78;
  char acStack_74 [16];
  char acStack_64 [100];
  
  if (in_RDI->name_ != (char *)0x0) {
    pCVar1 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar1->_vptr_CVmVarHeap[6])();
  }
  memset(&local_7c,0,0x5c);
  lVar2 = CVmFile::read_int4(in_stack_fffffffffffffe50);
  local_7c = (int)(lVar2 / 1000);
  this_00 = (CVmFile *)(long)local_7c;
  lVar2 = CVmFile::read_int4(this_00);
  local_78 = (int)this_00 + (int)(lVar2 / 1000);
  CVmFile::read_str_byte_prefix(in_stack_fffffffffffffe60,(char *)in_RDI,(size_t)this_00);
  strcpy(acStack_64,acStack_74);
  namelen = CVmFile::read_str_byte_prefix(in_stack_fffffffffffffe60,(char *)in_RDI,(size_t)this_00);
  pCVar3 = CVmTimeZoneCache::parse_zone
                     ((CVmTimeZoneCache *)in_RDI,(char *)this_00,in_stack_fffffffffffffe48);
  if (pCVar3 == (CVmTimeZone *)0x0) {
    CVmTimeZoneCache::create_missing_zone
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,namelen,(os_tzinfo_t *)0x0);
  }
  pvVar4 = vm_tzobj_ext::alloc_ext((CVmObjTimeZone *)in_stack_fffffffffffffe60,in_RDI);
  in_RDI->name_ = (char *)pvVar4;
  return;
}

Assistant:

void CVmObjTimeZone::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* 
     *   Read the GMT and DST offsets (in case we need a synthetic entry).
     *   Note that the saved values are in milliseconds, but os_tzinfo_t
     *   works in seconds, so adjust accordingly. 
     */
    os_tzinfo_t desc;
    memset(&desc, 0, sizeof(desc));
    desc.std_ofs = fp->read_int4() / 1000;
    desc.dst_ofs = desc.std_ofs + fp->read_int4() / 1000;

    /* read the abbreviation */
    fp->read_str_byte_prefix(desc.std_abbr, sizeof(desc.std_abbr));
    strcpy(desc.dst_abbr, desc.std_abbr);

    /* read the length and name */
    char name[256];
    size_t len = fp->read_str_byte_prefix(name, sizeof(name));

    /* look up our timezone object */
    CVmTimeZone *tz = G_tzcache->parse_zone(vmg_ name, len);

    /* if we didn't find it, create a dummy entry for it */
    if (tz == 0)
        tz = G_tzcache->create_missing_zone(vmg_ name, len, &desc);

    /* allocate the extension structure */
    vm_tzobj_ext *ext = vm_tzobj_ext::alloc_ext(vmg_ this, tz);
    ext_ = (char *)ext;
}